

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O3

void __thiscall
QGraphicsScene::drawItems
          (QGraphicsScene *this,QPainter *painter,int numItems,QGraphicsItem **items,
          QStyleOptionGraphicsItem *options,QWidget *widget)

{
  undefined1 *puVar1;
  ulong *puVar2;
  QGraphicsScenePrivate *this_00;
  double dVar3;
  qreal *pqVar4;
  QGraphicsItem *item;
  long lVar5;
  quint32 qVar6;
  QTransform *pQVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  byte bVar9;
  QRegion *local_d8;
  QArrayData *local_a8;
  long lStack_a0;
  qsizetype local_98;
  QGraphicsItem *local_90;
  QTransform local_88;
  long local_38;
  
  bVar9 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsScenePrivate **)(this + 8);
  if ((this_00->unpolishedItems).d.size != 0) {
    QGraphicsScenePrivate::_q_polishItems(this_00);
  }
  dVar3 = (double)QPainter::opacity();
  pqVar4 = (qreal *)QPainter::worldTransform();
  pQVar7 = &local_88;
  for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
    pQVar7->m_matrix[0][0] = *pqVar4;
    pqVar4 = pqVar4 + (ulong)bVar9 * -2 + 1;
    pQVar7 = (QTransform *)((long)pQVar7 + ((ulong)bVar9 * -2 + 1) * 8);
  }
  if (widget == (QWidget *)0x0) {
    qVar6 = this_00->rectAdjust;
  }
  else {
    lVar5 = QMetaObject::cast((QObject *)&QGraphicsView::staticMetaObject);
    qVar6 = this_00->rectAdjust;
    if (lVar5 != 0) {
      this_00->field_0xb8 = this_00->field_0xb8 & 0xfb;
      local_d8 = (QRegion *)(*(long *)(lVar5 + 8) + 0x548);
      if ((*(byte *)(*(long *)(lVar5 + 8) + 0x488) & 2) == 0) {
        this_00->rectAdjust = 2;
      }
      else {
        this_00->rectAdjust = 1;
      }
      goto LAB_0060d48c;
    }
  }
  local_d8 = (QRegion *)0x0;
LAB_0060d48c:
  local_a8 = (QArrayData *)0x0;
  lStack_a0 = 0;
  local_98 = 0;
  if (numItems < 1) {
    this_00->rectAdjust = qVar6;
  }
  else {
    uVar8 = 0;
    do {
      item = QGraphicsItem::topLevelItem(items[uVar8]);
      if ((((item->d_ptr).d)->field_0x161 & 0x40) == 0) {
        local_90 = item;
        QtPrivate::QPodArrayOps<QGraphicsItem*>::emplace<QGraphicsItem*&>
                  ((QPodArrayOps<QGraphicsItem*> *)&local_a8,local_98,&local_90);
        QList<QGraphicsItem_*>::end((QList<QGraphicsItem_*> *)&local_a8);
        puVar1 = &((item->d_ptr).d)->field_0x160;
        *(ulong *)puVar1 = *(ulong *)puVar1 | 0x4000;
        QGraphicsScenePrivate::drawSubtreeRecursive
                  (this_00,item,painter,&local_88,local_d8,widget,1.0,(QTransform *)0x0);
      }
      uVar8 = uVar8 + 1;
    } while ((uint)numItems != uVar8);
    this_00->rectAdjust = qVar6;
    if (local_98 != 0) {
      lVar5 = 0;
      do {
        puVar2 = (ulong *)(*(long *)(*(long *)(lStack_a0 + lVar5) + 8) + 0x160);
        *puVar2 = *puVar2 & 0xffffffffffffbfff;
        lVar5 = lVar5 + 8;
      } while (local_98 << 3 != lVar5);
    }
  }
  QPainter::setWorldTransform((QTransform *)painter,SUB81(&local_88,0));
  QPainter::setOpacity(dVar3);
  if (local_a8 != (QArrayData *)0x0) {
    LOCK();
    (local_a8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_a8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_a8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_a8,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsScene::drawItems(QPainter *painter,
                               int numItems,
                               QGraphicsItem *items[],
                               const QStyleOptionGraphicsItem options[], QWidget *widget)
{
    Q_D(QGraphicsScene);
    // Make sure we don't have unpolished items before we draw.
    if (!d->unpolishedItems.isEmpty())
        d->_q_polishItems();

    const qreal opacity = painter->opacity();
    QTransform viewTransform = painter->worldTransform();
    Q_UNUSED(options);

    // Determine view, expose and flags.
    QGraphicsView *view = widget ? qobject_cast<QGraphicsView *>(widget->parentWidget()) : 0;
    QRegion *expose = nullptr;
    const quint32 oldRectAdjust = d->rectAdjust;
    if (view) {
        d->updateAll = false;
        expose = &view->d_func()->exposedRegion;
        if (view->d_func()->optimizationFlags & QGraphicsView::DontAdjustForAntialiasing)
            d->rectAdjust = 1;
        else
            d->rectAdjust = 2;
    }

    // Find all toplevels, they are already sorted.
    QList<QGraphicsItem *> topLevelItems;
    for (int i = 0; i < numItems; ++i) {
        QGraphicsItem *item = items[i]->topLevelItem();
        if (!item->d_ptr->itemDiscovered) {
            topLevelItems << item;
            item->d_ptr->itemDiscovered = 1;
            d->drawSubtreeRecursive(item, painter, &viewTransform, expose, widget);
        }
    }

    d->rectAdjust = oldRectAdjust;
    // Reset discovery bits.
    for (auto topLevelItem : std::as_const(topLevelItems))
        topLevelItem->d_ptr->itemDiscovered = 0;

    painter->setWorldTransform(viewTransform);
    painter->setOpacity(opacity);
}